

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O2

void __thiscall leveldb::IteratorWrapper::SeekToFirst(IteratorWrapper *this)

{
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[3])();
    Update(this);
    return;
  }
  __assert_fail("iter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./table/iterator_wrapper.h"
                ,0x43,"void leveldb::IteratorWrapper::SeekToFirst()");
}

Assistant:

void SeekToFirst() {
    assert(iter_);
    iter_->SeekToFirst();
    Update();
  }